

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeAddParseSchemaOp(Vdbe *p,int iDb,char *zWhere,u16 p5)

{
  int addr;
  long lVar1;
  Parse *pPVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  
  addr = sqlite3VdbeAddOp3(p,0x95,iDb,0,0);
  sqlite3VdbeChangeP4(p,addr,zWhere,-6);
  if (0 < (long)p->nOp) {
    p->aOp[(long)p->nOp + -1].p5 = p5;
  }
  lVar3 = (long)p->db->nDb;
  if (0 < lVar3) {
    uVar4 = p->btreeMask;
    lVar5 = 8;
    lVar1 = 0;
    do {
      if ((lVar1 != 1) && (*(char *)(*(long *)((long)&p->db->aDb->zDbSName + lVar5) + 0x11) != '\0')
         ) {
        p->lockMask = p->lockMask | 1 << ((byte)lVar1 & 0x1f);
      }
      uVar4 = uVar4 | 1 << ((uint)lVar1 & 0x1f);
      lVar1 = lVar1 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar3 != lVar1);
    p->btreeMask = uVar4;
  }
  pPVar2 = p->pParse->pToplevel;
  if (pPVar2 == (Parse *)0x0) {
    pPVar2 = p->pParse;
  }
  pPVar2->mayAbort = '\x01';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeAddParseSchemaOp(Vdbe *p, int iDb, char *zWhere, u16 p5){
  int j;
  sqlite3VdbeAddOp4(p, OP_ParseSchema, iDb, 0, 0, zWhere, P4_DYNAMIC);
  sqlite3VdbeChangeP5(p, p5);
  for(j=0; j<p->db->nDb; j++) sqlite3VdbeUsesBtree(p, j);
  sqlite3MayAbort(p->pParse);
}